

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBucket.cpp
# Opt level: O1

void __thiscall
Memory::HeapBucketT<Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>_>::~HeapBucketT
          (HeapBucketT<Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>_> *this)

{
  uint uVar1;
  SmallHeapBlockT<MediumAllocationBlockAttributes> *this_00;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  SmallNormalHeapBlockT<MediumAllocationBlockAttributes> *pSVar5;
  ulong uVar6;
  
  HeapBlockList::
  ForEachEditing<Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>,Memory::HeapBucketT<Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>>::DeleteHeapBlockList(Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>*,Memory::Recycler*)::_lambda(Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>*)_1_>
            (this->heapBlockList,(SmallNormalHeapBlockT<MediumAllocationBlockAttributes> *)0x0,
             ((this->super_HeapBucket).heapInfo)->recycler);
  HeapBlockList::
  ForEachEditing<Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>,Memory::HeapBucketT<Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>>::DeleteHeapBlockList(Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>*,Memory::Recycler*)::_lambda(Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>*)_1_>
            (this->fullBlockList,(SmallNormalHeapBlockT<MediumAllocationBlockAttributes> *)0x0,
             ((this->super_HeapBucket).heapInfo)->recycler);
  if ((this->super_HeapBucket).heapBlockCount + (this->super_HeapBucket).newHeapBlockCount != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBucket.cpp"
                       ,0x69,"(this->heapBlockCount + this->newHeapBlockCount == 0)",
                       "this->heapBlockCount + this->newHeapBlockCount == 0");
    if (!bVar3) goto LAB_006ccb08;
    *puVar4 = 0;
  }
  uVar1 = (this->super_HeapBucket).emptyHeapBlockCount;
  pSVar5 = this->emptyBlockList;
  uVar6 = 0;
  while (pSVar5 != (SmallNormalHeapBlockT<MediumAllocationBlockAttributes> *)0x0) {
    this_00 = (pSVar5->super_SmallHeapBlockT<MediumAllocationBlockAttributes>).next;
    if (this_00 == (SmallHeapBlockT<MediumAllocationBlockAttributes> *)0x0) {
      pSVar5 = (SmallNormalHeapBlockT<MediumAllocationBlockAttributes> *)0x0;
    }
    else {
      pSVar5 = HeapBlock::AsNormalBlock<MediumAllocationBlockAttributes>(&this_00->super_HeapBlock);
    }
    uVar6 = uVar6 + 1;
  }
  if (uVar6 != uVar1) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBucket.cpp"
                       ,0x6b,
                       "(this->emptyHeapBlockCount == HeapBlockList::Count(this->emptyBlockList))",
                       "this->emptyHeapBlockCount == HeapBlockList::Count(this->emptyBlockList)");
    if (!bVar3) goto LAB_006ccb08;
    *puVar4 = 0;
  }
  HeapBlockList::
  ForEachEditing<Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>,Memory::HeapBucketT<Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>>::DeleteEmptyHeapBlockList(Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>*)::_lambda(Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>*)_1_>
            (this->emptyBlockList,0);
  if ((this->super_HeapBucket).newHeapBlockCount + (this->super_HeapBucket).heapBlockCount +
      (this->super_HeapBucket).emptyHeapBlockCount != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBucket.cpp"
                       ,0x6e,
                       "(this->heapBlockCount + this->newHeapBlockCount + this->emptyHeapBlockCount == 0)"
                       ,
                       "this->heapBlockCount + this->newHeapBlockCount + this->emptyHeapBlockCount == 0"
                      );
    if (!bVar3) {
LAB_006ccb08:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  return;
}

Assistant:

HeapBucketT<TBlockType>::~HeapBucketT()
{
    DeleteHeapBlockList(this->heapBlockList);
    DeleteHeapBlockList(this->fullBlockList);

#if ENABLE_ALLOCATIONS_DURING_CONCURRENT_SWEEP
#if SUPPORT_WIN32_SLIST
    if (allocableHeapBlockListHead != nullptr)
    {
        if (CONFIG_FLAG_RELEASE(EnableConcurrentSweepAlloc))
        {
            FlushInterlockedSList(this->allocableHeapBlockListHead);
        }

        _aligned_free(this->allocableHeapBlockListHead);
    }

    DeleteHeapBlockList(this->sweepableHeapBlockList);
#endif
#endif

#if defined(RECYCLER_SLOW_CHECK_ENABLED) || ENABLE_ALLOCATIONS_DURING_CONCURRENT_SWEEP
    Assert(this->heapBlockCount + this->newHeapBlockCount == 0);
#endif
    RECYCLER_SLOW_CHECK(Assert(this->emptyHeapBlockCount == HeapBlockList::Count(this->emptyBlockList)));
    DeleteEmptyHeapBlockList(this->emptyBlockList);
#if defined(RECYCLER_SLOW_CHECK_ENABLED)
    Assert(this->heapBlockCount + this->newHeapBlockCount + this->emptyHeapBlockCount == 0);
#endif
}